

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

void extractPackageName(char *filename,char *pkg,int32_t capacity)

{
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  int32_t len;
  char *basename;
  int32_t capacity_local;
  char *pkg_local;
  char *filename_local;
  
  __s = findBasename(filename);
  sVar3 = strlen(__s);
  iVar1 = (int)sVar3 + -4;
  if (0 < iVar1) {
    iVar2 = strcmp(__s + iVar1,".dat");
    if (iVar2 == 0) {
      if (capacity <= iVar1) {
        fprintf(_stderr,"icupkg: the package name \"%s\" is too long (>=%ld)\n",__s,(long)capacity);
        exit(1);
      }
      memcpy(pkg,__s,(long)iVar1);
      pkg[iVar1] = '\0';
      return;
    }
  }
  fprintf(_stderr,"icupkg: \"%s\" is not recognized as a package filename (must end with .dat)\n",
          __s);
  exit(1);
}

Assistant:

static void
extractPackageName(const char *filename,
                   char pkg[], int32_t capacity) {
    const char *basename;
    int32_t len;

    basename=findBasename(filename);
    len=(int32_t)strlen(basename)-4; /* -4: subtract the length of ".dat" */

    if(len<=0 || 0!=strcmp(basename+len, ".dat")) {
        fprintf(stderr, "icupkg: \"%s\" is not recognized as a package filename (must end with .dat)\n",
                         basename);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(len>=capacity) {
        fprintf(stderr, "icupkg: the package name \"%s\" is too long (>=%ld)\n",
                         basename, (long)capacity);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    memcpy(pkg, basename, len);
    pkg[len]=0;
}